

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O3

BOOL RemoveDirectoryW(LPCWSTR lpPathName)

{
  undefined8 lpPathName_00;
  int iVar1;
  BOOL BVar2;
  DWORD DVar3;
  size_t sVar4;
  SIZE_T count;
  long in_FS_OFFSET;
  DWORD local_74;
  undefined1 local_70 [8];
  PathCharString mb_dirPathString;
  
  mb_dirPathString.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  mb_dirPathString._32_8_ = local_70;
  mb_dirPathString.m_size = 0;
  local_74 = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0014e3c8;
  if (lpPathName == (LPCWSTR)0x0) {
    local_74 = 3;
    DVar3 = 3;
LAB_0014e32d:
    BVar2 = 0;
LAB_0014e32f:
    SetLastError(DVar3);
  }
  else {
    sVar4 = PAL_wcslen(lpPathName);
    count = sVar4 * 3 + 3;
    StackString<32UL,_char>::Resize((StackString<32UL,_char> *)local_70,count);
    lpPathName_00 = mb_dirPathString._32_8_;
    if (mb_dirPathString._32_8_ == 0) {
      local_74 = 8;
      DVar3 = 8;
      goto LAB_0014e32d;
    }
    iVar1 = WideCharToMultiByte(0,0,lpPathName,-1,(LPSTR)mb_dirPathString._32_8_,(int)count,
                                (LPCSTR)0x0,(LPBOOL)0x0);
    if ((ulong)(long)iVar1 < mb_dirPathString.m_size) {
      mb_dirPathString.m_size = (long)iVar1;
    }
    *(undefined1 *)(mb_dirPathString._32_8_ + mb_dirPathString.m_size) = 0;
    if (iVar1 == 0) {
      DVar3 = GetLastError();
      if (DVar3 == 0x7a) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0014e3c8;
        local_74 = 0xce;
        DVar3 = 0xce;
        goto LAB_0014e32d;
      }
      fprintf(_stderr,"] %s %s:%d","RemoveDirectoryW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/directory.cpp"
              ,0x121);
      BVar2 = 0;
      fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar3);
      local_74 = 0x54f;
      DVar3 = 0x54f;
      goto LAB_0014e32f;
    }
    BVar2 = RemoveDirectoryHelper((LPSTR)lpPathName_00,&local_74);
    if (BVar2 == 0) {
      BVar2 = 0;
    }
    else {
      BVar2 = 1;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0014e3c8;
    }
    DVar3 = local_74;
    if (local_74 != 0) goto LAB_0014e32f;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_70);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != mb_dirPathString.m_count) {
      __stack_chk_fail();
    }
    return BVar2;
  }
LAB_0014e3c8:
  abort();
}

Assistant:

BOOL
PALAPI
RemoveDirectoryW(
         IN LPCWSTR lpPathName)
{
    PathCharString mb_dirPathString;
    int   mb_size;
    DWORD dwLastError = 0;
    BOOL  bRet = FALSE;
    size_t length;
    char * mb_dir;

    PERF_ENTRY(RemoveDirectoryW);
    ENTRY("RemoveDirectoryW(lpPathName=%p (%S))\n",
          lpPathName?lpPathName:W16_NULLSTRING,
          lpPathName?lpPathName:W16_NULLSTRING);

    if (lpPathName == NULL) 
    {
        dwLastError = ERROR_PATH_NOT_FOUND;
        goto done;
    }

    length = (PAL_wcslen(lpPathName)+1) * 3;
    mb_dir = mb_dirPathString.OpenStringBuffer(length);
    if (NULL == mb_dir)
    {
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;        
    }

    mb_size = WideCharToMultiByte( CP_ACP, 0, lpPathName, -1, mb_dir, length,
                                   NULL, NULL );
    mb_dirPathString.CloseBuffer(mb_size);

    if( mb_size == 0 )
    {
        dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpPathName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            dwLastError = ERROR_FILENAME_EXCED_RANGE;
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            dwLastError = ERROR_INTERNAL_ERROR;
        }
        goto done;
    }

    if ((bRet = RemoveDirectoryHelper (mb_dir, &dwLastError)))
    {
        TRACE("Removal of directory [%s] was successful.\n", mb_dir);
    }

done:
    if( dwLastError )
    {
        SetLastError( dwLastError );
    }

    LOGEXIT("RemoveDirectoryW returns BOOL %d\n", bRet);
    PERF_EXIT(RemoveDirectoryW);
    return bRet;
}